

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::expr_stmt(analysis *this)

{
  TYPE TVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  allocator local_79;
  string local_78 [32];
  shared_ptr<dh::TreeNode> local_58;
  NodePtr tmp_ptr;
  int local_24;
  int local_20;
  undefined1 local_19;
  analysis *this_local;
  NodePtr *ret;
  
  local_19 = 0;
  this_local = this;
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_20 = token::getLineno(peVar2);
  std::make_shared<dh::TreeNode,char_const(&)[5],int>((char (*) [5])this,(int *)"Expr");
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_24 = 4;
  TreeNode::setNodeKind(peVar3,&stack0xffffffffffffffdc);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 7;
  TreeNode::setKind(peVar3,(int *)&tmp_ptr.
                                   super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  TVar1 = token::getType(peVar2);
  if (TVar1 == SEPOP) {
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<dh::TreeNode>::shared_ptr(&local_58,(nullptr_t)0x0);
    TreeNode::appendChild(peVar3,&local_58);
    std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_58);
  }
  else {
    expr((analysis *)&stack0xffffffffffffffb8);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    TreeNode::appendChild(peVar3,(NodePtr *)&stack0xffffffffffffffb8);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)&stack0xffffffffffffffb8)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,";",&local_79);
  match(in_RSI,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::expr_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in expr_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("Expr",tmp->getLineno());

	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ExpK);

	if ( tmp->getType() != TYPE::SEPOP)
	{
		NodePtr tmp_ptr = expr();
		ret->appendChild(tmp_ptr);
	} else 
	{
		ret->appendChild(nullptr);
	}
	match(";");

	return ret;
}